

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O2

void __thiscall
dg::vr::ValueRelations::RelatedValueIterator::nextViableValue(RelatedValueIterator *this)

{
  pointer ppVVar1;
  _Base_ptr p_Var2;
  VectorSet<const_llvm::Value_*> *pVVar3;
  
  while( true ) {
    pVVar3 = getCurrentEqual(this);
    ppVVar1 = (this->valueIt)._M_current;
    if (ppVVar1 !=
        (pVVar3->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      p_Var2 = (this->bucketIt)._M_node[1]._M_parent;
      (this->current).first = *ppVVar1;
      (this->current).second.bits.super__Base_bitset<1UL>._M_w = (_WordT)p_Var2;
      return;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
    ::operator++(&this->bucketIt);
    if ((_Rb_tree_header *)(this->bucketIt)._M_node ==
        &(this->related)._M_t._M_impl.super__Rb_tree_header) break;
    pVVar3 = getCurrentEqual(this);
    (this->valueIt)._M_current =
         (pVVar3->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  this->isEnd = true;
  return;
}

Assistant:

void nextViableValue() {
            while (valueIt == getCurrentEqual().end()) {
                ++bucketIt;
                if (bucketIt == related.end()) {
                    isEnd = true;
                    return;
                }
                valueIt = getCurrentEqual().begin();
            }
            updateCurrent();
        }